

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::EqFailure
          (AssertionResult *__return_storage_ptr__,char *expected_expression,char *actual_expression
          ,string *expected,string *actual,bool ignoring_case)

{
  bool bVar1;
  ostream *poVar2;
  char *str2;
  AssertionResult *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  AssertionResult local_1f8;
  undefined1 local_1c0 [8];
  iu_global_format_stringstream strm;
  bool ignoring_case_local;
  string *actual_local;
  string *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  
  strm.super_iu_stringstream._391_1_ = ignoring_case;
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1c0);
  poVar2 = std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8,"error: Value of ");
  poVar2 = std::operator<<(poVar2,actual_expression);
  poVar2 = std::operator<<(poVar2,"\n  Actual: ");
  poVar2 = std::operator<<(poVar2,(string *)actual);
  poVar2 = std::operator<<(poVar2,"\nExpected: ");
  std::operator<<(poVar2,expected_expression);
  if ((strm.super_iu_stringstream._391_1_ & 1) != 0) {
    std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8," (ignoring case)");
  }
  str2 = (char *)std::__cxx11::string::c_str();
  bVar1 = detail::IsStringEqual(expected_expression,str2);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8,"\nWhich is: ");
    std::operator<<(poVar2,(string *)expected);
  }
  AssertionFailure();
  std::__cxx11::stringstream::str();
  rhs = AssertionResult::operator<<(&local_1f8,&local_218);
  AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
  std::__cxx11::string::~string((string *)&local_218);
  AssertionResult::~AssertionResult(&local_1f8);
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult EqFailure(const char* expected_expression, const char* actual_expression
    , const ::std::string& expected, const ::std::string& actual, bool ignoring_case = false)
{
    iu_global_format_stringstream strm;
    strm << "error: Value of " << actual_expression
        << "\n  Actual: " << actual
        << "\nExpected: " << expected_expression;
    if( ignoring_case )
    {
        strm << " (ignoring case)";
    }
    if( !detail::IsStringEqual(expected_expression, expected.c_str()) )
    {
        strm << "\nWhich is: " << expected;
    }
    return AssertionFailure() << strm.str();
}